

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SharedDirectory.cpp
# Opt level: O0

bool __thiscall SharedDirectory::can_read_file(SharedDirectory *this,string *name)

{
  bool bVar1;
  bool local_8a;
  _Self local_78;
  _Self local_70 [3];
  string local_58;
  path local_38;
  string *local_18;
  string *name_local;
  SharedDirectory *this_local;
  
  local_18 = name;
  name_local = (string *)this;
  std::__cxx11::string::string((string *)&local_58,(string *)name);
  path_in_dir(&local_38,this,&local_58);
  bVar1 = boost::filesystem::exists(&local_38);
  local_8a = false;
  if (bVar1) {
    local_70[0]._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
         ::find(&this->indexed_files,local_18);
    local_78._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
         ::end(&this->indexed_files);
    local_8a = std::operator!=(local_70,&local_78);
  }
  boost::filesystem::path::~path(&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return local_8a;
}

Assistant:

bool SharedDirectory::can_read_file(const std::string &name) {
  return exists(path_in_dir(name)) && indexed_files.find(name) != indexed_files.end();
}